

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TPZQuadSphere.h
# Opt level: O1

void __thiscall
pzgeom::TPZQuadSphere<pzgeom::TPZGeoBlend<pzgeom::TPZGeoQuad>>::X<Fad<double>>
          (TPZQuadSphere<pzgeom::TPZGeoBlend<pzgeom::TPZGeoQuad>> *this,TPZFMatrix<double> *coord,
          TPZVec<Fad<double>_> *loc,TPZVec<Fad<double>_> *result)

{
  FadExpr<FadBinaryMul<Fad<double>,_FadCst<double>_>_> *pFVar1;
  uint uVar2;
  uint uVar3;
  int iVar4;
  void *pvVar5;
  double *pdVar6;
  Fad<double> *pFVar7;
  int i;
  long lVar8;
  ulong uVar9;
  int i_1;
  double *pdVar10;
  long lVar11;
  ulong uVar12;
  double dVar13;
  double dVar14;
  TPZManVector<Fad<double>,_3> xqsiLxc;
  TPZManVector<Fad<double>,_3> xqsi;
  undefined1 local_1b0 [16];
  double *local_1a0;
  FadExpr<FadBinaryDiv<FadExpr<FadBinaryMul<Fad<double>,_FadCst<double>_>_>,_Fad<double>_>_>
  *pFStack_198;
  double local_190;
  Fad<double> local_188;
  TPZVec<Fad<double>_> *local_168;
  Fad<double> local_160;
  FadExpr<FadBinaryDiv<FadExpr<FadBinaryMul<Fad<double>,_FadCst<double>_>_>,_Fad<double>_>_>
  local_140;
  TPZManVector<Fad<double>,_3> local_130;
  TPZManVector<Fad<double>,_3> local_b0;
  
  local_130.super_TPZVec<Fad<double>_>._vptr_TPZVec = (_func_int **)0x0;
  local_130.super_TPZVec<Fad<double>_>.fStore._0_4_ = 0;
  local_130.super_TPZVec<Fad<double>_>.fNElements = 0;
  local_130.super_TPZVec<Fad<double>_>.fNAlloc = 0;
  local_168 = result;
  TPZManVector<Fad<double>,_3>::TPZManVector(&local_b0,3,(Fad<double> *)&local_130);
  Fad<double>::~Fad((Fad<double> *)&local_130);
  local_1b0._0_8_ = (Fad<double> *)0x0;
  local_1b0._8_8_ = (ulong)(uint)local_1b0._12_4_ << 0x20;
  local_1a0 = (double *)0x0;
  pFStack_198 = (FadExpr<FadBinaryDiv<FadExpr<FadBinaryMul<Fad<double>,_FadCst<double>_>_>,_Fad<double>_>_>
                 *)0x0;
  TPZManVector<Fad<double>,_3>::TPZManVector(&local_130,3,(Fad<double> *)local_1b0);
  Fad<double>::~Fad((Fad<double> *)local_1b0);
  TPZGeoBlend<pzgeom::TPZGeoQuad>::X<Fad<double>>
            ((TPZGeoBlend<pzgeom::TPZGeoQuad> *)this,coord,loc,&local_b0.super_TPZVec<Fad<double>_>)
  ;
  local_188.val_ = 0.0;
  local_188.dx_.num_elts = 0;
  local_188.dx_.ptr_to_data = (double *)0x0;
  local_188.defaultVal = 0.0;
  lVar8 = 0;
  do {
    pFVar7 = local_b0.super_TPZVec<Fad<double>_>.fStore;
    lVar11 = lVar8 * 0x20;
    dVar13 = *(double *)(*(long *)(this + 0xa90) + lVar8 * 8);
    uVar2 = local_b0.super_TPZVec<Fad<double>_>.fStore[lVar8].dx_.num_elts;
    uVar3 = *(uint *)(CONCAT44(local_130.super_TPZVec<Fad<double>_>.fStore._4_4_,
                               local_130.super_TPZVec<Fad<double>_>.fStore._0_4_) + 8 + lVar11);
    pdVar10 = (double *)
              (CONCAT44(local_130.super_TPZVec<Fad<double>_>.fStore._4_4_,
                        local_130.super_TPZVec<Fad<double>_>.fStore._0_4_) + lVar11);
    if (uVar2 != uVar3) {
      if (uVar2 == 0) {
        if (uVar3 != 0) {
          if ((void *)pdVar10[2] != (void *)0x0) {
            operator_delete__((void *)pdVar10[2]);
          }
          *(undefined4 *)(pdVar10 + 1) = 0;
          pdVar10[2] = 0.0;
        }
      }
      else {
        if (uVar3 != 0) {
          if ((void *)pdVar10[2] != (void *)0x0) {
            operator_delete__((void *)pdVar10[2]);
          }
          *(undefined4 *)(pdVar10 + 1) = 0;
          pdVar10[2] = 0.0;
        }
        *(uint *)(pdVar10 + 1) = uVar2;
        uVar9 = (long)(int)uVar2 << 3;
        if ((int)uVar2 < 0) {
          uVar9 = 0xffffffffffffffff;
        }
        pvVar5 = operator_new__(uVar9);
        pdVar10[2] = (double)pvVar5;
      }
    }
    pFVar7 = pFVar7 + lVar8;
    if (uVar2 != 0) {
      dVar14 = pdVar10[2];
      if ((pFVar7->dx_).num_elts == 0) {
        if (0 < (int)uVar2) {
          uVar9 = 0;
          do {
            *(double *)((long)dVar14 + uVar9 * 8) = pFVar7->defaultVal;
            uVar9 = uVar9 + 1;
          } while (uVar2 != uVar9);
        }
      }
      else if (0 < (int)uVar2) {
        pdVar6 = (pFVar7->dx_).ptr_to_data;
        uVar9 = 0;
        do {
          *(double *)((long)dVar14 + uVar9 * 8) = pdVar6[uVar9];
          uVar9 = uVar9 + 1;
        } while (uVar2 != uVar9);
      }
    }
    *pdVar10 = pFVar7->val_ - dVar13;
    local_1b0._0_8_ =
         lVar11 + CONCAT44(local_130.super_TPZVec<Fad<double>_>.fStore._4_4_,
                           local_130.super_TPZVec<Fad<double>_>.fStore._0_4_);
    local_1b0._8_8_ = local_1b0._0_8_;
    Fad<double>::operator+=
              (&local_188,(FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_> *)local_1b0);
    lVar8 = lVar8 + 1;
  } while (lVar8 != 3);
  FadFuncSqrt<Fad<double>_>::FadFuncSqrt((FadFuncSqrt<Fad<double>_> *)&local_160,&local_188);
  FadExpr<FadFuncSqrt<Fad<double>_>_>::FadExpr
            ((FadExpr<FadFuncSqrt<Fad<double>_>_> *)local_1b0,
             (FadFuncSqrt<Fad<double>_> *)&local_160);
  Fad<double>::~Fad(&local_160);
  iVar4 = (int)local_1a0;
  uVar9 = (ulong)local_1a0 & 0xffffffff;
  if ((int)local_1a0 != local_188.dx_.num_elts) {
    if ((int)local_1a0 == 0) {
      if (local_188.dx_.num_elts == 0) goto LAB_00f655d8;
      if (local_188.dx_.ptr_to_data != (double *)0x0) {
        operator_delete__(local_188.dx_.ptr_to_data);
      }
      local_188.dx_.num_elts = 0;
      local_188.dx_.ptr_to_data = (double *)0x0;
    }
    else {
      lVar8 = (long)(int)local_1a0;
      if (local_188.dx_.num_elts != 0) {
        if (local_188.dx_.ptr_to_data != (double *)0x0) {
          operator_delete__(local_188.dx_.ptr_to_data);
        }
        local_188.dx_.ptr_to_data = (double *)0x0;
      }
      local_188.dx_.num_elts = iVar4;
      uVar12 = 0xffffffffffffffff;
      if (-1 < iVar4) {
        uVar12 = lVar8 << 3;
      }
      local_188.dx_.ptr_to_data = (double *)operator_new__(uVar12);
    }
  }
LAB_00f655d8:
  pdVar10 = local_188.dx_.ptr_to_data;
  if (iVar4 != 0) {
    if ((int)local_1a0 == 0) {
      if (0 < iVar4) {
        lVar8 = 0;
        do {
          pdVar6 = (double *)((long)&(pFStack_198->fadexpr_).left_ + lVar8);
          if ((int)local_1a0 == 0) {
            pdVar6 = &local_190;
          }
          dVar13 = *pdVar6;
          if ((double)local_1b0._8_8_ < 0.0) {
            dVar14 = sqrt((double)local_1b0._8_8_);
          }
          else {
            dVar14 = SQRT((double)local_1b0._8_8_);
          }
          *(double *)((long)pdVar10 + lVar8) = dVar13 / (dVar14 + dVar14);
          lVar8 = lVar8 + 8;
        } while (uVar9 * 8 - lVar8 != 0);
      }
    }
    else if (0 < iVar4) {
      uVar12 = 0;
      do {
        pFVar1 = (&(pFStack_198->fadexpr_).left_)[uVar12];
        if ((double)local_1b0._8_8_ < 0.0) {
          dVar13 = sqrt((double)local_1b0._8_8_);
        }
        else {
          dVar13 = SQRT((double)local_1b0._8_8_);
        }
        pdVar10[uVar12] = (double)pFVar1 / (dVar13 + dVar13);
        uVar12 = uVar12 + 1;
      } while (uVar9 != uVar12);
    }
  }
  if ((double)local_1b0._8_8_ < 0.0) {
    local_188.val_ = sqrt((double)local_1b0._8_8_);
  }
  else {
    local_188.val_ = SQRT((double)local_1b0._8_8_);
  }
  Fad<double>::~Fad((Fad<double> *)(local_1b0 + 8));
  lVar11 = 0;
  lVar8 = 0;
  do {
    local_1b0._8_8_ = *(undefined8 *)(*(long *)(this + 0xa90) + lVar8 * 8);
    local_160.val_ =
         (double)(CONCAT44(local_130.super_TPZVec<Fad<double>_>.fStore._4_4_,
                           local_130.super_TPZVec<Fad<double>_>.fStore._0_4_) + lVar11);
    local_160.dx_._0_8_ = *(undefined8 *)(this + 0xa80);
    local_160.dx_.ptr_to_data = (double *)0x0;
    local_140.fadexpr_.left_ = (FadExpr<FadBinaryMul<Fad<double>,_FadCst<double>_>_> *)&local_160;
    local_140.fadexpr_.right_ = &local_188;
    local_1a0 = (double *)0x0;
    pFStack_198 = &local_140;
    Fad<double>::operator=
              ((Fad<double> *)((long)&local_168->fStore->val_ + lVar11),
               (FadExpr<FadBinaryAdd<FadCst<double>,_FadExpr<FadBinaryDiv<FadExpr<FadBinaryMul<Fad<double>,_FadCst<double>_>_>,_Fad<double>_>_>_>_>
                *)local_1b0);
    lVar8 = lVar8 + 1;
    lVar11 = lVar11 + 0x20;
  } while (lVar8 != 3);
  Fad<double>::~Fad(&local_188);
  TPZManVector<Fad<double>,_3>::~TPZManVector(&local_130);
  TPZManVector<Fad<double>,_3>::~TPZManVector(&local_b0);
  return;
}

Assistant:

void X(TPZFMatrix<REAL> &coord,TPZVec<T> &loc,TPZVec<T> &result) const
		{
            TPZManVector<T,3> xqsi(3,0.); // will store (x,y,z) from (qsi,eta)
            TPZManVector<T,3> xqsiLxc(3,0.); // will store (x,y,z)-xc
            GeomQuad::X(coord,loc,xqsi); // gives the map (qsi,eta) to (x,y,z)
            
            T norm = 0.;
            for (int i = 0; i < 3; i++) { // Does xqsi-xc and calculates its norm
                xqsiLxc[i] = xqsi[i] - fxc[i];
                norm += xqsiLxc[i] * xqsiLxc[i];
            }
            norm = sqrt(norm);
            
            for (int i = 0; i < 3; i++) {
                result[i] = fxc[i] + xqsiLxc[i] * fR / norm;
            }
                
            
		}